

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O1

void dukglue_read<std::vector<Dog*,std::allocator<Dog*>>>
               (duk_context *ctx,duk_idx_t arg_idx,vector<Dog_*,_std::allocator<Dog_*>_> *out)

{
  duk_idx_t in_ECX;
  vector<Dog_*,_std::allocator<Dog_*>_> local_28;
  
  dukglue::types::DukType<std::vector<Dog*,std::allocator<Dog*>>>::
  read<std::vector<Dog*,std::allocator<Dog*>>>
            (&local_28,(DukType<std::vector<Dog*,std::allocator<Dog*>>> *)ctx,
             (duk_context *)(ulong)(uint)arg_idx,in_ECX);
  std::vector<Dog_*,_std::allocator<Dog_*>_>::_M_move_assign(out,&local_28);
  if (local_28.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void dukglue_read(duk_context* ctx, duk_idx_t arg_idx, RetT* out)
{
	// ArgStorage has some static_asserts in it that validate value types,
	// so we typedef it to force ArgStorage<RetType> to compile and run the asserts
	typedef typename dukglue::types::ArgStorage<RetT>::type ValidateReturnType;

	using namespace dukglue::types;
	*out = DukType<typename Bare<RetT>::type>::template read<RetT>(ctx, arg_idx);
}